

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateConstructorBody
          (MessageGenerator *this,Printer *printer,vector<bool,_std::allocator<bool>_> *processed,
          bool copy_constructor)

{
  FieldDescriptor *field_00;
  _Hash_node_base *p_Var1;
  bool bVar2;
  Type TVar3;
  mapped_type *pmVar4;
  __node_base_ptr p_Var5;
  FieldGenerator *pFVar6;
  pointer ppFVar7;
  char *pcVar8;
  long lVar9;
  pointer ppFVar10;
  int iVar11;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  int iVar12;
  ulong uVar13;
  FieldDescriptor *last_start;
  FieldDescriptor *field;
  string pod_template;
  string first_field_name;
  string last_field_name;
  RunMap runs;
  key_type local_f8;
  cpp *local_f0;
  _Hash_node_base *local_e8;
  FieldGeneratorMap *local_e0;
  Printer *local_d8;
  char *local_d0;
  undefined8 local_c8;
  char local_c0;
  undefined7 uStack_bf;
  string local_b0;
  ulong local_90;
  string local_88;
  _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_f8 = (FieldDescriptor *)0x0;
  local_d8 = printer;
  std::
  _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::_Hashtable(&local_68,0,(hash<const_google::protobuf::FieldDescriptor_*> *)&local_d0,
               (key_equal *)&local_b0,(allocator_type *)&local_88);
  ppFVar7 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->optimized_order_).
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish != ppFVar7) {
    uVar13 = 0;
    do {
      field_00 = ppFVar7[uVar13];
      if (copy_constructor) {
        bVar2 = anon_unknown_0::IsPOD(field_00);
        if (!bVar2) goto LAB_0025cc82;
LAB_0025cc44:
        if (local_f8 == (FieldDescriptor *)0x0) {
          local_f8 = field_00;
        }
        pmVar4 = std::__detail::
                 _Map_base<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)&local_68,&local_f8);
        *pmVar4 = *pmVar4 + 1;
      }
      else {
        bVar2 = anon_unknown_0::CanInitializeByZeroing(field_00);
        if ((bVar2) ||
           ((*(int *)(field_00 + 0x4c) != 3 &&
            (TVar3 = FieldDescriptor::type(field_00),
            *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar3 * 4) == 10))))
        goto LAB_0025cc44;
LAB_0025cc82:
        local_f8 = (FieldDescriptor *)0x0;
      }
      uVar13 = uVar13 + 1;
      ppFVar7 = (this->optimized_order_).
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(this->optimized_order_).
                                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar7 >> 3)
            );
  }
  local_d0 = &local_c0;
  local_c8 = 0;
  local_c0 = '\0';
  pcVar8 = 
  "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n"
  ;
  if (copy_constructor) {
    pcVar8 = 
    "::memcpy(&$first$_, &from.$first$_,\n  reinterpret_cast<char*>(&$last$_) -\n  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n"
    ;
  }
  std::__cxx11::string::_M_replace((ulong)&local_d0,0,(char *)0x0,(ulong)pcVar8);
  ppFVar7 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppFVar10 = (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar10 != ppFVar7) {
    local_e0 = &this->field_generators_;
    uVar13 = 0;
    local_90 = 0x800000000000003f;
    iVar12 = 0;
    do {
      iVar11 = iVar12 + 0x3f;
      if (-1 < iVar12) {
        iVar11 = iVar12;
      }
      if (((processed->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p
           [(long)(iVar11 >> 6) +
            (ulong)((uVar13 & local_90) < 0x8000000000000001) + 0xffffffffffffffff] >>
           (uVar13 & 0x3f) & 1) == 0) {
        local_f0 = (cpp *)ppFVar7[uVar13];
        p_Var5 = std::
                 _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 ::_M_find_before_node
                           (&local_68,(ulong)local_f0 % local_68._M_bucket_count,
                            (key_type *)&local_f0,(__hash_code)local_f0);
        if (((p_Var5 == (__node_base_ptr)0x0) || (p_Var5->_M_nxt == (_Hash_node_base *)0x0)) ||
           (p_Var1 = p_Var5->_M_nxt[2]._M_nxt, p_Var1 < (_Hash_node_base *)0x2)) {
          if (copy_constructor) {
            pFVar6 = FieldGeneratorMap::get(local_e0,(FieldDescriptor *)local_f0);
            lVar9 = 0x60;
          }
          else {
            pFVar6 = FieldGeneratorMap::get(local_e0,(FieldDescriptor *)local_f0);
            lVar9 = 0x70;
          }
          (**(code **)((long)pFVar6->_vptr_FieldGenerator + lVar9))(pFVar6,local_d8);
        }
        else {
          local_e8 = p_Var1;
          FieldName_abi_cxx11_(&local_b0,local_f0,field_01);
          FieldName_abi_cxx11_
                    (&local_88,
                     (cpp *)(this->optimized_order_).
                            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[(long)local_e8 + (uVar13 - 1)]
                     ,field_02);
          io::Printer::Print(local_d8,local_d0,"first",&local_b0,"last",&local_88);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88._M_dataplus._M_p != &local_88.field_2) {
            operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
          }
          iVar12 = iVar12 + (int)local_e8 + -1;
        }
        ppFVar7 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppFVar10 = (this->optimized_order_).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
      }
      iVar12 = iVar12 + 1;
      uVar13 = (ulong)iVar12;
    } while (uVar13 < (ulong)((long)ppFVar10 - (long)ppFVar7 >> 3));
  }
  if (local_d0 != &local_c0) {
    operator_delete(local_d0,CONCAT71(uStack_bf,local_c0) + 1);
  }
  std::
  _Hashtable<const_google::protobuf::FieldDescriptor_*,_std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<const_google::protobuf::FieldDescriptor_*>,_google::protobuf::hash<const_google::protobuf::FieldDescriptor_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void MessageGenerator::GenerateConstructorBody(io::Printer* printer,
                                               std::vector<bool> processed,
                                               bool copy_constructor) const {
  const FieldDescriptor* last_start = NULL;
  // RunMap maps from fields that start each run to the number of fields in that
  // run.  This is optimized for the common case that there are very few runs in
  // a message and that most of the eligible fields appear together.
  typedef hash_map<const FieldDescriptor*, size_t> RunMap;
  RunMap runs;

  for (int i = 0; i < optimized_order_.size(); ++i) {
    const FieldDescriptor* field = optimized_order_[i];
    if ((copy_constructor && IsPOD(field)) ||
        (!copy_constructor && CanConstructByZeroing(field, options_))) {
      if (last_start == NULL) {
        last_start = field;
      }

      runs[last_start]++;
    } else {
      last_start = NULL;
    }
  }

  string pod_template;
  if (copy_constructor) {
    pod_template =
        "::memcpy(&$first$_, &from.$first$_,\n"
        "  reinterpret_cast<char*>(&$last$_) -\n"
        "  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n";
  } else {
    pod_template =
        "::memset(&$first$_, 0, reinterpret_cast<char*>(&$last$_) -\n"
        "  reinterpret_cast<char*>(&$first$_) + sizeof($last$_));\n";
  }

  for (int i = 0; i < optimized_order_.size(); ++i) {
    if (processed[i]) {
      continue;
    }

    const FieldDescriptor* field = optimized_order_[i];
    RunMap::const_iterator it = runs.find(field);

    // We only apply the memset technique to runs of more than one field, as
    // assignment is better than memset for generated code clarity.
    if (it != runs.end() && it->second > 1) {
      // Use a memset, then skip run_length fields.
      const size_t run_length = it->second;
      const string first_field_name = FieldName(field);
      const string last_field_name =
          FieldName(optimized_order_[i + run_length - 1]);

      printer->Print(pod_template.c_str(),
        "first", first_field_name,
        "last", last_field_name);

      i += run_length - 1;
      // ++i at the top of the loop.
    } else {
      if (copy_constructor) {
        field_generators_.get(field).GenerateCopyConstructorCode(printer);
      } else {
        field_generators_.get(field).GenerateConstructorCode(printer);
      }
    }
  }
}